

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O3

void __thiscall csv::CSVReader::initial_read(CSVReader *this)

{
  thread local_28;
  CSVReader *local_20;
  code *local_18;
  undefined8 local_10;
  
  local_18 = read_csv;
  local_10 = 0;
  local_20 = this;
  std::thread::
  thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
            (&local_28,(offset_in_CSVReader_to_subr *)&local_18,&local_20,
             &internals::ITERATION_CHUNK_SIZE);
  if ((this->read_csv_worker)._M_id._M_thread == 0) {
    (this->read_csv_worker)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    std::thread::join();
    return;
  }
  std::terminate();
}

Assistant:

void initial_read() {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();
        }